

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O2

void WebPReplaceTransparentPixels(WebPPicture *pic,uint32_t color)

{
  int iVar1;
  uint32_t *puVar2;
  
  if ((pic != (WebPPicture *)0x0) && (pic->use_argb != 0)) {
    iVar1 = pic->height;
    puVar2 = pic->argb;
    WebPInitAlphaProcessing();
    for (; 0 < iVar1; iVar1 = iVar1 + -1) {
      (*WebPAlphaReplace)(puVar2,pic->width,color & 0xffffff);
      puVar2 = puVar2 + pic->argb_stride;
    }
  }
  return;
}

Assistant:

void WebPReplaceTransparentPixels(WebPPicture* const pic, uint32_t color) {
  if (pic != NULL && pic->use_argb) {
    int y = pic->height;
    uint32_t* argb = pic->argb;
    color &= 0xffffffu;   // force alpha=0
    WebPInitAlphaProcessing();
    while (y-- > 0) {
      WebPAlphaReplace(argb, pic->width, color);
      argb += pic->argb_stride;
    }
  }
}